

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FM.cpp
# Opt level: O2

GainedMove __thiscall GainContainer::getBestMove(GainContainer *this,uint max_diff)

{
  bool bVar1;
  GainedCell GVar2;
  GainedCell GVar3;
  uint uVar4;
  ulong uVar5;
  GainBuckets *this_00;
  uint uVar6;
  GainedMove GVar7;
  
  this_00 = (this->buckets_).super__Vector_base<GainBuckets,_std::allocator<GainBuckets>_>._M_impl.
            super__Vector_impl_data._M_start;
  uVar4 = this_00->num_elems_ - this_00[1].num_elems_;
  uVar6 = -uVar4;
  if (0 < (int)uVar4) {
    uVar6 = uVar4;
  }
  if (uVar6 < max_diff) {
    GVar2 = GainBuckets::getMaxGainedCell(this_00);
    GVar3 = GainBuckets::getMaxGainedCell
                      ((this->buckets_).
                       super__Vector_base<GainBuckets,_std::allocator<GainBuckets>_>._M_impl.
                       super__Vector_impl_data._M_start + 1);
    bVar1 = GVar2.second <= GVar3.second;
    this_00 = (this->buckets_).super__Vector_base<GainBuckets,_std::allocator<GainBuckets>_>._M_impl
              .super__Vector_impl_data._M_start;
  }
  else {
    bVar1 = (int)this_00->num_elems_ <= (int)this_00[1].num_elems_;
  }
  GVar2 = GainBuckets::getMaxGainedCell(this_00 + bVar1);
  uVar5 = 0x10000000000;
  if (bVar1 != false) {
    uVar5 = 0x100000000;
  }
  GVar7.first = (Move)((ulong)GVar2 & 0xffffffff | uVar5);
  GVar7.second = GVar2.second;
  return GVar7;
}

Assistant:

GainContainer::GainedMove GainContainer::getBestMove(unsigned max_diff) const {
  PartId from_part;
  int FstPartElems = buckets_[0].getNumElems(),
      SndPartElems = buckets_[1].getNumElems();
  if (std::abs(FstPartElems - SndPartElems) < max_diff)
    from_part = buckets_[0].getMaxGainedCell().second >
                buckets_[1].getMaxGainedCell().second ?
                0 : 1;
  else if (FstPartElems > SndPartElems)
    from_part = 0;
  else if (FstPartElems < SndPartElems)
    from_part = 1;
  auto [cell, gain] = buckets_[from_part].getMaxGainedCell();
  return GainedMove{{cell, from_part, OppositePart(from_part)}, gain};
}